

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O1

int Abc_ResMigrate(DdManager *dd,DdNode *bFunc,int nInputs,uint *uParts,int iPart1,int iPart2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint local_70;
  uint local_6c;
  
  local_6c = uParts[iPart1];
  local_70 = uParts[iPart2];
  if ((local_70 & local_6c) != 0) {
    __assert_fail("(uParts[iPart1] & uParts[iPart2]) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x13f,"int Abc_ResMigrate(DdManager *, DdNode *, int, unsigned int *, int, int)")
    ;
  }
  iVar1 = Abc_ResCost(dd,bFunc,local_6c,(int *)0x0,(int *)0x0);
  iVar2 = Abc_ResCost(dd,bFunc,uParts[iPart2],(int *)0x0,(int *)0x0);
  if (nInputs < 1) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    uVar7 = 0;
    do {
      if ((uParts[iPart1] >> (uVar7 & 0x1f) & 1) != 0) {
        uVar5 = 0;
        do {
          uVar8 = 1 << ((byte)uVar5 & 0x1f);
          if ((uVar7 != uVar5) && ((uParts[iPart2] & uVar8) != 0)) {
            uVar8 = uVar8 | 1 << ((byte)uVar7 & 0x1f);
            uParts[iPart1] = uParts[iPart1] ^ uVar8;
            uParts[iPart2] = uParts[iPart2] ^ uVar8;
            iVar3 = Abc_ResCost(dd,bFunc,uParts[iPart1],(int *)0x0,(int *)0x0);
            iVar4 = Abc_ResCost(dd,bFunc,uParts[iPart2],(int *)0x0,(int *)0x0);
            if (iVar4 + iVar3 < iVar2 + iVar1) {
              local_6c = uParts[iPart1];
              local_70 = uParts[iPart2];
              iVar6 = 1;
            }
            uParts[iPart1] = uParts[iPart1] ^ uVar8;
            uParts[iPart2] = uParts[iPart2] ^ uVar8;
          }
          uVar5 = uVar5 + 1;
        } while (nInputs != uVar5);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != nInputs);
  }
  uParts[iPart1] = local_6c;
  uParts[iPart2] = local_70;
  return iVar6;
}

Assistant:

int Abc_ResMigrate( DdManager * dd, DdNode * bFunc, int nInputs, unsigned uParts[], int iPart1, int iPart2 )
{
    unsigned uParts2[2] = { uParts[iPart1], uParts[iPart2] };
    int i, k, CostCur, CostBest, fChange = 0;
    assert( (uParts[iPart1] & uParts[iPart2]) == 0 );
    CostBest = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) 
             + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
    for ( i = 0; i < nInputs; i++ )
    if ( uParts[iPart1] & (1 << i) )
    {
        for ( k = 0; k < nInputs; k++ )
        if ( uParts[iPart2] & (1 << k) )
        {
            if ( i == k )
                continue;
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
            CostCur = Abc_ResCost( dd, bFunc, uParts[iPart1], NULL, NULL ) + Abc_ResCost( dd, bFunc, uParts[iPart2], NULL, NULL );
            if ( CostCur < CostBest )
            {
                CostCur    = CostBest;
                uParts2[0] = uParts[iPart1];
                uParts2[1] = uParts[iPart2];
                fChange = 1;
            }
            uParts[iPart1] ^= (1 << i) | (1 << k);
            uParts[iPart2] ^= (1 << i) | (1 << k);
        }
    }
    uParts[iPart1] = uParts2[0];
    uParts[iPart2] = uParts2[1];
    return fChange;
}